

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m128i *palVar13;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong size;
  long lVar37;
  long lVar38;
  bool bVar39;
  longlong lVar40;
  ulong uVar41;
  ulong uVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i_64_t A;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i_64_t B;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int64_t iVar52;
  long lVar53;
  __m128i_64_t B_2;
  long lVar55;
  undefined1 auVar54 [16];
  long lVar56;
  long lVar57;
  long lVar58;
  __m128i_64_t e;
  __m128i_64_t h;
  int local_138;
  ulong local_110;
  __m128i *local_f8;
  longlong local_58 [5];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse2_128_64_cold_4();
        }
        else {
          uVar29 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse2_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_64_cold_1();
          }
          else {
            iVar9 = uVar3 - 1;
            uVar1 = (ulong)uVar3 + 1;
            size = uVar1 >> 1;
            uVar36 = (uint)size;
            iVar10 = iVar9 / (int)uVar36;
            uVar17 = iVar9 % (int)uVar36;
            uVar15 = (ulong)(uint)open;
            iVar32 = -open;
            iVar18 = ppVar5->min;
            uVar19 = 0x8000000000000000 - (long)iVar18;
            if (iVar18 != iVar32 && SBORROW4(iVar18,iVar32) == iVar18 + open < 0) {
              uVar19 = uVar15 | 0x8000000000000000;
            }
            iVar18 = ppVar5->max;
            ppVar12 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
            if (ppVar12 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            ppVar12->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x2820802;
            palVar13 = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && palVar13 != (__m128i *)0x0)) {
              iVar11 = s2Len + -1;
              uVar41 = (ulong)(uint)gap;
              local_110 = uVar19 + 1;
              lVar26 = 0x7ffffffffffffffe - (long)iVar18;
              auVar44._8_4_ = (int)local_110;
              auVar44._0_8_ = local_110;
              auVar44._12_4_ = (int)(local_110 >> 0x20);
              auVar47._8_4_ = (int)lVar26;
              auVar47._0_8_ = lVar26;
              auVar47._12_4_ = (int)((ulong)lVar26 >> 0x20);
              auVar46._8_8_ = -(ulong)(iVar10 == 1);
              auVar46._0_8_ = -(ulong)(iVar10 == 0);
              lVar20 = (long)iVar32;
              uVar28 = 0;
              do {
                lVar33 = 0;
                lVar31 = lVar20;
                do {
                  lVar21 = lVar31;
                  if (s1_beg != 0) {
                    lVar21 = 0;
                  }
                  local_58[lVar33 + 2] = lVar21;
                  local_58[lVar33] = lVar21 - uVar15;
                  lVar33 = lVar33 + 1;
                  lVar31 = lVar31 - size * (uint)gap;
                } while (lVar33 == 1);
                palVar13[uVar28][0] = local_58[2];
                palVar13[uVar28][1] = local_58[3];
                ptr_00[uVar28][0] = local_58[0];
                ptr_00[uVar28][1] = local_58[1];
                uVar28 = uVar28 + 1;
                lVar20 = lVar20 - (ulong)(uint)gap;
              } while (uVar28 != size);
              *ptr_01 = 0;
              uVar28 = 1;
              iVar18 = iVar32;
              do {
                iVar25 = 0;
                if (s2_beg == 0) {
                  iVar25 = iVar18;
                }
                ptr_01[uVar28] = (long)iVar25;
                uVar28 = uVar28 + 1;
                iVar18 = iVar18 - gap;
              } while (s2Len + 1 != uVar28);
              uVar28 = 1;
              if (1 < s2Len) {
                uVar28 = uVar29;
              }
              lVar20 = size * uVar29 * 4;
              lVar33 = (ulong)(uVar36 + (uVar36 == 0)) << 4;
              lVar31 = 0;
              uVar24 = 0;
              auVar48 = auVar44;
              auVar49 = auVar44;
              local_138 = iVar11;
              do {
                local_f8 = ptr;
                ptr = palVar13;
                iVar18 = ppVar5->mapper[(byte)s2[uVar24]];
                iVar52 = ptr_01[uVar24];
                lVar40 = ptr[uVar36 - 1][0];
                lVar27 = 0;
                lVar21 = lVar31;
                auVar50 = auVar44;
                do {
                  plVar2 = (long *)((long)pvVar4 + lVar27 + (long)iVar18 * (long)(int)uVar36 * 0x10)
                  ;
                  lVar53 = iVar52 + *plVar2;
                  lVar55 = lVar40 + plVar2[1];
                  lVar56 = *(long *)((long)*ptr_00 + lVar27);
                  lVar57 = *(long *)((long)*ptr_00 + lVar27 + 8);
                  if (lVar53 <= lVar56) {
                    lVar53 = lVar56;
                  }
                  if (lVar55 <= lVar57) {
                    lVar55 = lVar57;
                  }
                  lVar14 = auVar50._0_8_;
                  if (lVar53 <= lVar14) {
                    lVar53 = lVar14;
                  }
                  lVar38 = auVar50._8_8_;
                  if (lVar55 <= lVar38) {
                    lVar55 = lVar38;
                  }
                  lVar22 = auVar49._0_8_;
                  if (auVar49._0_8_ <= lVar53) {
                    lVar22 = lVar53;
                  }
                  lVar16 = auVar49._8_8_;
                  if (auVar49._8_8_ <= lVar55) {
                    lVar16 = lVar55;
                  }
                  lVar34 = auVar47._0_8_;
                  if (lVar53 <= auVar47._0_8_) {
                    lVar34 = lVar53;
                  }
                  lVar37 = auVar47._8_8_;
                  if (lVar55 <= auVar47._8_8_) {
                    lVar37 = lVar55;
                  }
                  if (lVar56 <= lVar34) {
                    lVar34 = lVar56;
                  }
                  if (lVar57 <= lVar37) {
                    lVar37 = lVar57;
                  }
                  if (lVar14 <= lVar34) {
                    lVar34 = lVar14;
                  }
                  plVar2 = (long *)((long)*ptr_00 + lVar27);
                  lVar56 = *plVar2;
                  lVar57 = plVar2[1];
                  plVar2 = (long *)((long)*local_f8 + lVar27);
                  *plVar2 = lVar53;
                  plVar2[1] = lVar55;
                  if (lVar38 <= lVar37) {
                    lVar37 = lVar38;
                  }
                  piVar6 = ((ppVar12->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar21) = (int)lVar53;
                  lVar53 = lVar53 - uVar15;
                  lVar58 = lVar55 - (ulong)(uint)open;
                  lVar56 = lVar56 - uVar41;
                  uVar43 = (ulong)(uint)gap;
                  lVar57 = lVar57 - uVar43;
                  if (lVar56 <= lVar53) {
                    lVar56 = lVar53;
                  }
                  *(int *)((long)piVar6 + lVar20 + lVar21) = (int)lVar55;
                  if (lVar57 <= lVar58) {
                    lVar57 = lVar58;
                  }
                  if (lVar53 < (long)(lVar14 - uVar41)) {
                    lVar53 = lVar14 - uVar41;
                  }
                  if (lVar58 < (long)(lVar38 - uVar43)) {
                    lVar58 = lVar38 - uVar43;
                  }
                  auVar49._8_8_ = lVar16;
                  auVar49._0_8_ = lVar22;
                  auVar47._8_8_ = lVar37;
                  auVar47._0_8_ = lVar34;
                  plVar2 = (long *)((long)*ptr_00 + lVar27);
                  *plVar2 = lVar56;
                  plVar2[1] = lVar57;
                  auVar50._8_8_ = lVar58;
                  auVar50._0_8_ = lVar53;
                  plVar2 = (long *)((long)*ptr + lVar27);
                  iVar52 = *plVar2;
                  lVar40 = plVar2[1];
                  lVar27 = lVar27 + 0x10;
                  lVar21 = lVar21 + uVar29 * 4;
                } while (lVar33 != lVar27);
                iVar18 = 0;
                do {
                  lVar21 = (long)iVar32;
                  if (s2_beg == 0) {
                    lVar21 = ptr_01[uVar24 + 1] - uVar15;
                  }
                  auVar50._8_8_ = auVar50._0_8_;
                  auVar50._0_8_ = lVar21;
                  bVar39 = true;
                  uVar35 = 1;
                  lVar27 = 0;
                  lVar21 = lVar31;
                  do {
                    lVar55 = auVar50._0_8_;
                    lVar56 = *(long *)((long)*local_f8 + lVar27);
                    lVar57 = lVar55;
                    if (lVar55 < lVar56) {
                      lVar57 = lVar56;
                    }
                    lVar56 = *(long *)((long)*local_f8 + lVar27 + 8);
                    lVar14 = auVar50._8_8_;
                    lVar53 = lVar14;
                    if (lVar14 < lVar56) {
                      lVar53 = lVar56;
                    }
                    plVar2 = (long *)((long)*local_f8 + lVar27);
                    *plVar2 = lVar57;
                    plVar2[1] = lVar53;
                    lVar56 = auVar47._0_8_;
                    if (lVar57 <= auVar47._0_8_) {
                      lVar56 = lVar57;
                    }
                    lVar38 = auVar47._8_8_;
                    if (lVar53 <= auVar47._8_8_) {
                      lVar38 = lVar53;
                    }
                    auVar47._8_8_ = lVar38;
                    auVar47._0_8_ = lVar56;
                    lVar22 = auVar49._0_8_;
                    if (auVar49._0_8_ <= lVar57) {
                      lVar22 = lVar57;
                    }
                    lVar16 = auVar49._8_8_;
                    if (auVar49._8_8_ <= lVar53) {
                      lVar16 = lVar53;
                    }
                    auVar49._8_8_ = lVar16;
                    auVar49._0_8_ = lVar22;
                    piVar6 = ((ppVar12->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar21) = (int)lVar57;
                    *(int *)((long)piVar6 + lVar20 + lVar21) = (int)lVar53;
                    auVar50._0_8_ = lVar55 - uVar41;
                    auVar50._8_8_ = lVar14 - uVar43;
                    uVar23 = -(ulong)((long)(lVar53 - (ulong)(uint)open) < auVar50._8_8_);
                    auVar54._8_8_ = uVar23;
                    auVar54._0_8_ = -(ulong)((long)(lVar57 - uVar15) < auVar50._0_8_);
                    if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar54 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar54 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar54 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar54 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar54 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar54 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (uVar23 >> 7 & 1) == 0) && (uVar23 >> 0xf & 1) == 0) &&
                            (uVar23 >> 0x17 & 1) == 0) && (uVar23 >> 0x1f & 1) == 0) &&
                          (uVar23 >> 0x27 & 1) == 0) && (uVar23 >> 0x2f & 1) == 0) &&
                        (uVar23 >> 0x37 & 1) == 0) && -1 < (long)uVar23) break;
                    bVar39 = uVar35 < size;
                    lVar27 = lVar27 + 0x10;
                    lVar21 = lVar21 + uVar29 * 4;
                    uVar35 = uVar35 + 1;
                  } while (lVar33 != lVar27);
                } while ((!bVar39) && (bVar39 = iVar18 == 0, iVar18 = iVar18 + 1, bVar39));
                lVar27 = auVar48._0_8_;
                lVar21 = local_f8[uVar17][0];
                uVar43 = local_f8[uVar17][1];
                uVar23 = auVar48._8_8_;
                uVar35 = uVar23;
                if ((long)uVar23 < (long)uVar43) {
                  uVar35 = uVar43;
                }
                lVar57 = lVar27;
                if (lVar27 < lVar21) {
                  lVar57 = lVar21;
                }
                auVar51._8_8_ = -(ulong)((long)uVar23 < (long)uVar43);
                auVar51._0_8_ = -(ulong)(lVar27 < lVar21);
                auVar51 = auVar51 & auVar46;
                auVar48._8_8_ = uVar35;
                auVar48._0_8_ = lVar57;
                if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar51 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar51 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar51 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar51 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar51 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar51 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar51 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar51 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar51 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar51 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar51 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar51[0xf] < '\0') {
                  local_138 = (int)uVar24;
                }
                uVar24 = uVar24 + 1;
                lVar31 = lVar31 + 4;
                palVar13 = local_f8;
                if (uVar24 == uVar28) {
                  if ((s2_end != 0) && (local_110 = uVar35, iVar10 < 1)) {
                    do {
                      local_110 = auVar48._0_8_;
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = local_110;
                      auVar48 = auVar7 << 0x40;
                    } while (iVar10 < 0);
                  }
                  iVar18 = iVar9;
                  if ((s1_end != 0) && ((uVar1 & 0x7ffffffe) != 0)) {
                    uVar29 = 0;
                    do {
                      uVar30 = 0;
                      if ((uVar29 & 1) != 0) {
                        uVar30 = uVar36;
                      }
                      iVar32 = uVar30 + ((uint)(uVar29 >> 1) & 0x7fffffff);
                      iVar25 = iVar18;
                      uVar1 = local_110;
                      iVar8 = local_138;
                      if ((iVar32 < (int)uVar3) &&
                         (uVar15 = (*local_f8)[uVar29], iVar25 = iVar32, uVar1 = uVar15,
                         iVar8 = iVar11, (long)uVar15 <= (long)local_110)) {
                        if (iVar18 <= iVar32) {
                          iVar32 = iVar18;
                        }
                        if (local_138 != iVar11) {
                          iVar32 = iVar18;
                        }
                        iVar25 = iVar18;
                        uVar1 = local_110;
                        iVar8 = local_138;
                        if (uVar15 == local_110) {
                          iVar25 = iVar32;
                        }
                      }
                      local_138 = iVar8;
                      local_110 = uVar1;
                      iVar18 = iVar25;
                      uVar29 = uVar29 + 1;
                    } while ((uVar36 & 0x3fffffff) * 2 != (int)uVar29);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    lVar40 = local_f8[uVar17][0];
                    local_110._0_4_ = (int)local_f8[uVar17][1];
                    iVar18 = iVar9;
                    local_138 = iVar11;
                    if (iVar10 < 1) {
                      do {
                        local_110._0_4_ = (int)lVar40;
                        lVar40 = 0;
                      } while (iVar10 < 0);
                    }
                  }
                  auVar42._8_8_ = -(ulong)(lVar38 <= (long)uVar19);
                  auVar42._0_8_ = -(ulong)(lVar56 <= (long)uVar19);
                  auVar45._8_8_ = -(ulong)(lVar26 < lVar16);
                  auVar45._0_8_ = -(ulong)(lVar26 < lVar22);
                  auVar45 = auVar45 | auVar42;
                  if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar45 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar45 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar45 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar45 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar45[0xf] < '\0') {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    local_110._0_4_ = 0;
                    local_138 = 0;
                    iVar18 = 0;
                  }
                  ppVar12->score = (int)local_110;
                  ppVar12->end_query = iVar18;
                  ppVar12->end_ref = local_138;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(local_f8);
                  return ppVar12;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}